

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

bool sq_aux_gettypedarg(HSQUIRRELVM v,SQInteger idx,SQObjectType type,SQObjectPtr **o)

{
  SQObjectPtr *pSVar1;
  SQString *x;
  SQChar *pSVar2;
  bool bVar3;
  undefined1 local_40 [8];
  SQObjectPtr oval;
  SQObjectPtr **o_local;
  SQObjectType type_local;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  oval.super_SQObject._unVal = (SQObjectValue)o;
  pSVar1 = stack_get(v,idx);
  ((oval.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
  _vptr_SQRefCounted = (_func_int **)pSVar1;
  bVar3 = *(SQObjectType *)
           ((oval.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
           super_SQRefCounted._vptr_SQRefCounted == type;
  if (!bVar3) {
    x = SQVM::PrintObjVal(v,(SQObjectPtr *)
                            ((oval.super_SQObject._unVal.pTable)->super_SQDelegable).
                            super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_40,x);
    pSVar2 = IdType2Name(type);
    SQVM::Raise_Error(v,"wrong argument type, expected \'%s\' got \'%.50s\'",pSVar2,
                      oval.super_SQObject._0_8_ + 0x38);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_40);
  }
  return bVar3;
}

Assistant:

static bool sq_aux_gettypedarg(HSQUIRRELVM v,SQInteger idx,SQObjectType type,SQObjectPtr **o)
{
    *o = &stack_get(v,idx);
    if(type(**o) != type){
        SQObjectPtr oval = v->PrintObjVal(**o);
        v->Raise_Error(_SC("wrong argument type, expected '%s' got '%.50s'"),IdType2Name(type),_stringval(oval));
        return false;
    }
    return true;
}